

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void * __thiscall dgMeshEffect::GetNextEdge(dgMeshEffect *this,void *edge)

{
  int iVar1;
  Iterator iter;
  Iterator local_28;
  
  iVar1 = *(int *)((long)edge + 0x50);
  local_28.m_ptr = (dgRedBackNode *)edge;
  local_28.m_tree = (dgTree<dgEdge,_long> *)this;
  dgTree<dgEdge,_long>::Iterator::operator++(&local_28,0);
  while( true ) {
    if (local_28.m_ptr == (dgRedBackNode *)0x0) {
      return (void *)0x0;
    }
    if (*(int *)&local_28.m_ptr[2]._vptr_dgRedBackNode != iVar1) break;
    dgTree<dgEdge,_long>::Iterator::operator++(&local_28,0);
  }
  *(int *)&local_28.m_ptr[2]._vptr_dgRedBackNode = iVar1;
  *(int *)(*(long *)&local_28.m_ptr[1].field_0x20 + 0x28) = iVar1;
  return local_28.m_ptr;
}

Assistant:

void* dgMeshEffect::GetNextEdge (const void* const edge)
{
	dgTreeNode* node = (dgTreeNode*) edge;
	hacd::HaI32 mark = node->GetInfo().m_mark;

	Iterator iter (*this);
	iter.Set (node);
	for (iter ++; iter; iter ++) {
		dgTreeNode* node = iter.GetNode();
		if (node->GetInfo().m_mark != mark) {
			node->GetInfo().m_mark = mark;
			node->GetInfo().m_twin->m_mark = mark;
			return node; 
		}
	}
	return NULL; 
}